

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::mark_as_packable(CompilerMSL *this,SPIRType *type)

{
  uint uVar1;
  SPIRType *pSVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = (type->parent_type).id;
  while (uVar1 != 0) {
    type = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + uVar1);
    uVar1 = (type->parent_type).id;
  }
  if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
    Compiler::set_extended_decoration
              ((Compiler *)this,(type->super_IVariant).self.id,
               SPIRVCrossDecorationBufferBlockRepacked,0);
    uVar4 = (ulong)(uint)(type->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
    if (uVar4 != 0) {
      uVar5 = 0;
      do {
        pSVar2 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            (type->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                            [uVar5].id);
        mark_as_packable(this,pSVar2);
        uVar3 = (ulong)(pSVar2->type_alias).id;
        if (uVar3 != 0) {
          pSVar2 = Variant::get<spirv_cross::SPIRType>
                             ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr + uVar3);
          mark_as_packable(this,pSVar2);
        }
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
  }
  return;
}

Assistant:

void CompilerMSL::mark_as_packable(SPIRType &type)
{
	// If this is not the base type (eg. it's a pointer or array), tunnel down
	if (type.parent_type)
	{
		mark_as_packable(get<SPIRType>(type.parent_type));
		return;
	}

	if (type.basetype == SPIRType::Struct)
	{
		set_extended_decoration(type.self, SPIRVCrossDecorationBufferBlockRepacked);

		// Recurse
		uint32_t mbr_cnt = uint32_t(type.member_types.size());
		for (uint32_t mbr_idx = 0; mbr_idx < mbr_cnt; mbr_idx++)
		{
			uint32_t mbr_type_id = type.member_types[mbr_idx];
			auto &mbr_type = get<SPIRType>(mbr_type_id);
			mark_as_packable(mbr_type);
			if (mbr_type.type_alias)
			{
				auto &mbr_type_alias = get<SPIRType>(mbr_type.type_alias);
				mark_as_packable(mbr_type_alias);
			}
		}
	}
}